

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool AddLocal(CService *addr_,int nScore)

{
  string_view source_file;
  bool bVar1;
  uint16_t uVar2;
  Network net;
  Logger *pLVar3;
  _Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_> _Var4;
  int *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_bool> pVar5;
  CService addr;
  string log_msg;
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  direct_or_indirect local_f0;
  uint local_e0;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_118._0_4_ = nScore;
  MaybeFlipIPv6toCJDNS((CService *)&local_f0.indirect_contents,addr_);
  bVar1 = CNetAddr::IsRoutable((CNetAddr *)&local_f0.indirect_contents);
  if ((bVar1) && ((fDiscover != false || (3 < (int)local_118._0_4_)))) {
    net = CNetAddr::GetNetwork((CNetAddr *)&local_f0.indirect_contents);
    bVar1 = ReachableNets::Contains(&g_reachable_nets,net);
    if (bVar1) {
      CService::ToStringAddrPort_abi_cxx11_
                ((string *)(local_118 + 8),(CService *)&local_f0.indirect_contents);
      pLVar3 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar3);
      if (bVar1) {
        local_48._M_string_length = 0;
        local_48.field_2._M_local_buf[0] = '\0';
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        tinyformat::format<std::__cxx11::string,int>
                  (&local_68,(tinyformat *)"AddLocal(%s,%i)\n",local_118 + 8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_48,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pLVar3 = LogInstance();
        local_68._M_dataplus._M_p = (pointer)0x50;
        local_68._M_string_length = 0x80f524;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file._M_len = 0x50;
        str._M_str = local_48._M_dataplus._M_p;
        str._M_len = local_48._M_string_length;
        logging_function._M_str = "AddLocal";
        logging_function._M_len = 8;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x119,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,
                          CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                   local_48.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._8_8_ != &local_100) {
        operator_delete((void *)local_118._8_8_,local_100._M_allocated_capacity + 1);
      }
      local_48._M_dataplus._M_p = (pointer)&g_maplocalhost_mutex;
      local_48._M_string_length = local_48._M_string_length & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_48);
      local_68._M_dataplus._M_p = (pointer)0x0;
      pVar5 = std::
              _Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
              ::_M_emplace_unique<CService&,LocalServiceInfo>
                        ((_Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
                          *)&mapLocalHost,(CService *)&local_f0.indirect_contents,
                         (LocalServiceInfo *)&local_68);
      _Var4 = pVar5.first._M_node;
      if ((((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         ((int)_Var4._M_node[2]._M_color <= (int)local_118._0_4_)) {
        _Var4._M_node[2]._M_color = (uint)(byte)(pVar5.second ^ 1) + local_118._0_4_;
        uVar2 = CService::GetPort((CService *)&local_f0.indirect_contents);
        *(uint16_t *)&_Var4._M_node[2].field_0x4 = uVar2;
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_48);
      bVar1 = true;
      goto LAB_0019ca04;
    }
  }
  bVar1 = false;
LAB_0019ca04:
  if (0x10 < local_e0) {
    free(local_f0.indirect_contents.indirect);
    local_f0.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CService& addr_, int nScore)
{
    CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    if (!addr.IsRoutable())
        return false;

    if (!fDiscover && nScore < LOCAL_MANUAL)
        return false;

    if (!g_reachable_nets.Contains(addr))
        return false;

    LogPrintf("AddLocal(%s,%i)\n", addr.ToStringAddrPort(), nScore);

    {
        LOCK(g_maplocalhost_mutex);
        const auto [it, is_newly_added] = mapLocalHost.emplace(addr, LocalServiceInfo());
        LocalServiceInfo &info = it->second;
        if (is_newly_added || nScore >= info.nScore) {
            info.nScore = nScore + (is_newly_added ? 0 : 1);
            info.nPort = addr.GetPort();
        }
    }

    return true;
}